

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,StateVar *var)

{
  uint uVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<(os,"Name: ");
  poVar2 = std::operator<<(poVar2,(string *)&(var->super_NamedVar).name_);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"PrevName:");
  poVar2 = std::operator<<(poVar2,(string *)&var->prev_name_);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"CurrName:");
  poVar2 = std::operator<<(poVar2,(string *)&var->curr_name_);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"FullyObs:");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(os,"Values:");
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(var->super_NamedVar).super_Variable.values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(var->super_NamedVar).super_Variable.values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    poVar2 = std::operator<<(os," ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"=");
    std::operator<<(poVar2,(string *)
                           ((var->super_NamedVar).super_Variable.values_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar1));
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const StateVar& var) {
	os << "Name: " << var.name_ << endl;
	os << "PrevName:" << var.prev_name_ << endl;
	os << "CurrName:" << var.curr_name_ << endl;
	os << "FullyObs:" << var.observed_ << endl;
	os << "Values:";

	for (unsigned int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	return os;
}